

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t driver::zesRasGetConfig(zes_ras_handle_t hRas,zes_ras_config_t *pConfig)

{
  zes_pfnRasGetConfig_t pfnGetConfig;
  ze_result_t result;
  zes_ras_config_t *pConfig_local;
  zes_ras_handle_t hRas_local;
  
  pfnGetConfig._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cdd8 != (code *)0x0) {
    pfnGetConfig._4_4_ = (*DAT_0011cdd8)(hRas,pConfig);
  }
  return pfnGetConfig._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesRasGetConfig(
        zes_ras_handle_t hRas,                          ///< [in] Handle for the component.
        zes_ras_config_t* pConfig                       ///< [in,out] Will be populed with the current RAS configuration -
                                                        ///< thresholds used to trigger events
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetConfig = context.zesDdiTable.Ras.pfnGetConfig;
        if( nullptr != pfnGetConfig )
        {
            result = pfnGetConfig( hRas, pConfig );
        }
        else
        {
            // generic implementation
        }

        return result;
    }